

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O0

bool glslang::TDefaultIoResolverBase::isImageType(TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_11;
  TType *type_local;
  
  iVar1 = (*type->_vptr_TType[7])();
  local_11 = false;
  if (iVar1 == 0xe) {
    iVar1 = (*type->_vptr_TType[8])();
    local_11 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar1));
  }
  return local_11;
}

Assistant:

static bool isImageType(const glslang::TType& type) {
        return type.getBasicType() == glslang::EbtSampler && type.getSampler().isImage();
    }